

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O2

ostream * operator<<(ostream *ostr,gcstring *str)

{
  char *pcVar1;
  
  pcVar1 = (char *)(**(code **)(*(long *)str + 0x48))(str);
  std::operator<<(ostr,pcVar1);
  return ostr;
}

Assistant:

inline std::ostream & operator <<(std::ostream &ostr, const GENICAM_NAMESPACE::gcstring &str)
{
    try
    {
        // use formatted output operator of std::string
        ostr << str.c_str();
    }
    catch(std::bad_alloc &)
    {
        GENICAM_NAMESPACE::ThrowBadAlloc(__FILE__, __LINE__);
    }
    return ostr;
}